

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_misc_functions.cc
# Opt level: O3

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __thiscall
draco::CreateCornerTableFromAttribute(draco *this,Mesh *mesh,Type type)

{
  bool bVar1;
  PointAttribute *pPVar2;
  pointer paVar3;
  ulong uVar4;
  ulong uVar5;
  int j;
  long lVar6;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> IVar7;
  FaceType new_face;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  faces;
  undefined8 local_48;
  uint local_40;
  vector<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
  local_38;
  
  pPVar2 = PointCloud::GetNamedAttribute(&mesh->super_PointCloud,type);
  if (pPVar2 == (PointAttribute *)0x0) {
    *(undefined8 *)this = 0;
  }
  else {
    std::
    vector<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
    ::vector(&local_38,
             (ulong)(uint)((int)((ulong)((long)(mesh->faces_).vector_.
                                               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)(mesh->faces_).vector_.
                                              super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                          -0x55555555),(allocator_type *)&local_48);
    local_40 = 0;
    local_48 = 0;
    paVar3 = (mesh->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar4 = ((long)(mesh->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
            -0x5555555555555555;
    if ((int)uVar4 != 0) {
      bVar1 = pPVar2->identity_mapping_;
      uVar5 = 0;
      do {
        lVar6 = 0;
        do {
          IVar7.value_ = paVar3->_M_elems[lVar6].value_;
          if (bVar1 == false) {
            IVar7.value_ = (pPVar2->indices_map_).vector_.
                           super__Vector_base<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[IVar7.value_].value_;
          }
          *(uint *)((long)&local_48 + lVar6 * 4) = IVar7.value_;
          lVar6 = lVar6 + 1;
        } while (lVar6 != 3);
        local_38.
        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_elems[2].value_ = local_40;
        *(undefined8 *)
         local_38.
         super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_elems = local_48;
        uVar5 = uVar5 + 1;
        paVar3 = paVar3 + 1;
      } while (uVar5 != (uVar4 & 0xffffffff));
    }
    CornerTable::Create((CornerTable *)this,
                        (IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
                         *)&local_38);
    if (local_38.
        super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_38.
                      super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_38.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_38.
                            super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CornerTable> CreateCornerTableFromAttribute(
    const Mesh *mesh, GeometryAttribute::Type type) {
  typedef CornerTable::FaceType FaceType;

  const PointAttribute *const att = mesh->GetNamedAttribute(type);
  if (att == nullptr) {
    return nullptr;
  }
  IndexTypeVector<FaceIndex, FaceType> faces(mesh->num_faces());
  FaceType new_face;
  for (FaceIndex i(0); i < mesh->num_faces(); ++i) {
    const Mesh::Face &face = mesh->face(i);
    for (int j = 0; j < 3; ++j) {
      // Map general vertex indices to attribute indices.
      new_face[j] = att->mapped_index(face[j]).value();
    }
    faces[FaceIndex(i)] = new_face;
  }
  // Build the corner table.
  return CornerTable::Create(faces);
}